

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O2

void uo_cb_stack_push(uo_cb *cb,void *item)

{
  size_t sVar1;
  void **__ptr;
  
  __ptr = (cb->stack).items;
  sVar1 = (cb->stack).count;
  (cb->stack).count = sVar1 + 1;
  if (sVar1 == (cb->stack).capacity) {
    (cb->stack).capacity = sVar1 * 2;
    __ptr = (void **)realloc(__ptr,sVar1 << 4);
    (cb->stack).items = __ptr;
  }
  __ptr[sVar1] = item;
  return;
}

Assistant:

inline void uo_cb_stack_push(
    uo_cb *cb,
    void *item)
{
    uo_stack_push(&cb->stack, item);
}